

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIStaticText::CGUIStaticText
          (CGUIStaticText *this,wchar_t *text,bool border,IGUIEnvironment *environment,
          IGUIElement *parent,s32 id,rect<int> *rectangle,bool background)

{
  int iVar1;
  u32 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  rect<int> local_48;
  
  *(undefined ***)&this->field_0x180 = &PTR__IReferenceCounted_0025f7e0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(undefined4 *)&this->field_0x190 = 1;
  local_48.UpperLeftCorner = rectangle->UpperLeftCorner;
  local_48.LowerRightCorner = rectangle->LowerRightCorner;
  IGUIElement::IGUIElement
            ((IGUIElement *)this,&PTR_construction_vtable_24__00270428,EGUIET_STATIC_TEXT,
             environment,parent,id,&local_48);
  *(undefined8 *)this = 0x270218;
  *(undefined8 *)&this->field_0x180 = 0x270408;
  this->HAlign = EGUIA_UPPERLEFT;
  this->VAlign = EGUIA_UPPERLEFT;
  this->Border = border;
  this->OverrideColorEnabled = false;
  this->OverrideBGColorEnabled = false;
  this->WordWrap = false;
  this->Background = background;
  this->RestrainTextInside = true;
  this->RightToLeft = false;
  this->OverrideColor = 0x65ffffff;
  this->BGColor = 0x65d2d2d2;
  this->OverrideFont = (IGUIFont *)0x0;
  this->LastBreakFont = (IGUIFont *)0x0;
  (this->BrokenText).m_data.
  super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BrokenText).m_data.
  super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BrokenText).m_data.
  super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BrokenText).is_sorted = true;
  core::string<wchar_t>::operator=((string<wchar_t> *)&this->field_0xa8,text);
  if (environment != (IGUIEnvironment *)0x0) {
    iVar1 = (*environment->_vptr_IGUIEnvironment[0xc])(environment);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*environment->_vptr_IGUIEnvironment[0xc])(environment);
      uVar2 = (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar1))
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar1),2);
      (this->BGColor).color = uVar2;
    }
  }
  return;
}

Assistant:

CGUIStaticText::CGUIStaticText(const wchar_t *text, bool border,
		IGUIEnvironment *environment, IGUIElement *parent,
		s32 id, const core::rect<s32> &rectangle,
		bool background) :
		IGUIStaticText(environment, parent, id, rectangle),
		HAlign(EGUIA_UPPERLEFT), VAlign(EGUIA_UPPERLEFT),
		Border(border), OverrideColorEnabled(false), OverrideBGColorEnabled(false), WordWrap(false), Background(background),
		RestrainTextInside(true), RightToLeft(false),
		OverrideColor(video::SColor(101, 255, 255, 255)), BGColor(video::SColor(101, 210, 210, 210)),
		OverrideFont(0), LastBreakFont(0)
{
#ifdef _DEBUG
	setDebugName("CGUIStaticText");
#endif

	Text = text;
	if (environment && environment->getSkin()) {
		BGColor = environment->getSkin()->getColor(gui::EGDC_3D_FACE);
	}
}